

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absolute.cpp
# Opt level: O2

string * fs_absolute_abi_cxx11_(string *__return_storage_ptr__,string_view path,bool expand_tilde)

{
  string_view path_00;
  bool bVar1;
  string_view path_01;
  string_view fname;
  error_code ec;
  string_view path_local;
  string ex;
  path a;
  path local_30;
  
  path_local._M_str = path._M_str;
  path_local._M_len = path._M_len;
  if (path_local._M_len == 0) {
    fs_get_cwd_abi_cxx11_();
  }
  else {
    if (expand_tilde) {
      fs_expanduser_abi_cxx11_(&ex,path);
    }
    else {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&ex,&path_local,(allocator<char> *)&a);
    }
    if (ex._M_string_length == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      path_01._M_str = ex._M_dataplus._M_p;
      path_01._M_len = ex._M_string_length;
      bVar1 = fs_is_absolute(path_01);
      if (bVar1) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ex);
      }
      else {
        ec._M_value = 0;
        ec._M_cat = (error_category *)std::_V2::system_category();
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_30,&ex,auto_format);
        std::filesystem::absolute(&a,(error_code *)&local_30);
        std::filesystem::__cxx11::path::~path(&local_30);
        if (ec._M_value == 0) {
          std::filesystem::__cxx11::path::generic_string(__return_storage_ptr__,&a);
        }
        else {
          path_00._M_str = path_local._M_str;
          path_00._M_len = path_local._M_len;
          fname._M_str = "fs_absolute";
          fname._M_len = 0xb;
          fs_print_error(path_00,fname,&ec);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        }
        std::filesystem::__cxx11::path::~path(&a);
      }
    }
    std::__cxx11::string::~string((string *)&ex);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fs_absolute(std::string_view path, const bool expand_tilde)
{
  // wraps std::filesystem::absolute(path).
  // path need not exist
  // Inspired by Python pathlib.Path.absolute()
  // https://docs.python.org/3/library/pathlib.html#pathlib.Path.absolute

  // Linux, MinGW can't handle empty paths
  if(path.empty())
    return fs_get_cwd();

  const std::string ex = expand_tilde
    ? fs_expanduser(path)
    : std::string(path);

  if (ex.empty()) FFS_UNLIKELY
    return {};

  if (fs_is_absolute(ex))
    return ex;

#ifdef HAVE_CXX_FILESYSTEM
  std::error_code ec;

  const auto a = std::filesystem::absolute(ex, ec);

  if(!ec) FFS_LIKELY
    return a.generic_string();

  fs_print_error(path, __func__, ec);
  return {};
#else
  std::string a = fs_get_cwd();
  if(a.empty())
    return {};

  a.push_back('/');
  a.append(ex);

  // NOT normalized to be consistent with <filesystem>
  return a;
#endif
}